

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.cpp
# Opt level: O1

void __thiscall
Nova::Triangulated_Surface<float>::Initialize_Cylinder_Tessellation
          (Triangulated_Surface<float> *this,Cylinder<float> *cylinder,int m,int n,bool create_caps)

{
  Simplex_Mesh<3> *this_00;
  pointer pVVar1;
  pointer pVVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined4 in_register_00000014;
  float fVar6;
  float fVar7;
  undefined3 in_register_00000081;
  float fVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  double dVar12;
  Vector<float,_3,_true> data_copy;
  TV local_a0;
  float local_94;
  float local_90;
  int local_8c;
  float local_88;
  float local_84;
  float local_80 [4];
  ulong local_70;
  undefined4 local_64;
  undefined8 local_60;
  ulong local_58;
  double local_50;
  Triangulated_Surface<float> *local_48;
  ulong local_40;
  ulong local_38;
  
  local_64 = CONCAT31(in_register_00000081,create_caps);
  local_60 = CONCAT44(in_register_00000014,m);
  uVar9 = (ulong)(uint)n;
  pVVar1 = (this->super_Point_Cloud<float,_3>).points._data.
           super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Point_Cloud<float,_3>).points._data.
      super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->super_Point_Cloud<float,_3>).points._data.
    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->super_Simplex_Mesh<3>).elements._data.
           super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Simplex_Mesh<3>).elements._data.
      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->super_Simplex_Mesh<3>).elements._data.
    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  local_8c = m + -1;
  if (0 < m) {
    local_90 = (float)two_pi / (float)n;
    local_88 = *(float *)cylinder / (float)local_8c;
    local_70 = 1;
    do {
      if (0 < n) {
        local_58 = CONCAT44(local_58._4_4_,(float)((int)local_70 + -1) * local_88);
        iVar10 = 1;
        do {
          local_94 = *(float *)(cylinder + 4);
          local_50 = (double)((float)(iVar10 + -1) * local_90);
          dVar12 = sin(local_50);
          local_94 = (float)dVar12 * local_94;
          local_84 = *(float *)(cylinder + 4);
          dVar12 = cos(local_50);
          local_80[0] = (float)local_58;
          local_80[1] = local_94;
          local_80[2] = (float)dVar12 * local_84;
          local_a0._data._M_elems._0_8_ = *(undefined8 *)(cylinder + 0x14);
          local_a0._data._M_elems[2] = *(float *)(cylinder + 0x1c);
          lVar5 = 0;
          do {
            *(float *)((long)local_a0._data._M_elems + lVar5) =
                 *(float *)((long)local_a0._data._M_elems + lVar5) +
                 *(float *)((long)local_80 + lVar5);
            lVar5 = lVar5 + 4;
          } while (lVar5 != 0xc);
          Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_a0);
          bVar11 = iVar10 != n;
          iVar10 = iVar10 + 1;
        } while (bVar11);
      }
      iVar10 = (int)local_70;
      local_70 = (ulong)(iVar10 + 1);
    } while (iVar10 != (int)local_60);
  }
  if ((char)local_64 != '\0') {
    local_80[2] = 0.0;
    local_80[0] = 0.0;
    local_80[1] = 0.0;
    local_a0._data._M_elems._0_8_ = *(undefined8 *)(cylinder + 0x14);
    local_a0._data._M_elems[2] = *(float *)(cylinder + 0x1c);
    lVar5 = 0;
    do {
      *(float *)((long)local_a0._data._M_elems + lVar5) =
           *(float *)((long)local_a0._data._M_elems + lVar5) + *(float *)((long)local_80 + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_a0);
    local_80[0] = *(float *)cylinder;
    local_80[1] = 0.0;
    local_80[2] = 0.0;
    local_a0._data._M_elems._0_8_ = *(undefined8 *)(cylinder + 0x14);
    local_a0._data._M_elems[2] = *(float *)(cylinder + 0x1c);
    lVar5 = 0;
    do {
      *(float *)((long)local_a0._data._M_elems + lVar5) =
           *(float *)((long)local_a0._data._M_elems + lVar5) + *(float *)((long)local_80 + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_a0);
  }
  local_48 = this;
  if (0 < n) {
    this_00 = &this->super_Simplex_Mesh<3>;
    local_70 = (ulong)(uint)(n * (int)local_60);
    local_88 = (float)(n * (int)local_60 + 1);
    local_38 = (ulong)(local_8c * n - 1);
    local_90 = 0.0;
    local_50 = 4.94065645841247e-324;
    local_40 = uVar9;
    do {
      local_84 = (float)(SUB84(local_50,0) + 1);
      uVar3 = (uint)local_84;
      if (SUB84(local_50,0) == (int)uVar9) {
        uVar3 = 1;
      }
      local_58 = (ulong)uVar3;
      if (1 < (int)local_60) {
        iVar10 = local_8c;
        fVar6 = local_90;
        fVar7 = (float)(uVar3 - 1);
        do {
          local_94 = (float)((int)uVar9 + (int)fVar6);
          fVar8 = (float)((int)local_40 + (int)fVar7);
          local_a0._data._M_elems[1] = local_94;
          local_a0._data._M_elems[0] = fVar6;
          local_a0._data._M_elems[2] = fVar8;
          Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_a0);
          local_a0._data._M_elems[1] = fVar8;
          local_a0._data._M_elems[2] = fVar7;
          Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_a0);
          iVar10 = iVar10 + -1;
          uVar9 = local_40;
          fVar6 = local_94;
          fVar7 = fVar8;
        } while (iVar10 != 0);
      }
      iVar10 = SUB84(local_50,0);
      if ((char)local_64 != '\0') {
        iVar4 = (int)local_58;
        local_a0._data._M_elems[2] = (float)(iVar4 + -1);
        local_a0._data._M_elems[1] = (float)(iVar10 + -1);
        local_a0._data._M_elems[0] = (float)local_70;
        Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_a0);
        local_a0._data._M_elems[2] = (float)((int)local_38 + iVar10);
        local_a0._data._M_elems[1] = (float)(iVar4 + (int)local_38);
        local_a0._data._M_elems[0] = local_88;
        Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_a0);
      }
      local_90 = (float)((int)local_90 + 1);
      local_50 = (double)(ulong)(uint)local_84;
    } while (iVar10 != (int)uVar9);
  }
  (local_48->super_Simplex_Mesh<3>).number_of_nodes =
       ((long)(local_48->super_Point_Cloud<float,_3>).points._data.
              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_48->super_Point_Cloud<float,_3>).points._data.
              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  return;
}

Assistant:

void Nova::Triangulated_Surface<T>::
Initialize_Cylinder_Tessellation(const Cylinder<T>& cylinder,const int m,const int n,const bool create_caps)
{
    points.Clear();elements.Clear();

    T dtheta=(T)two_pi/n,dlength=cylinder.height/(m-1);
    for(int i=1;i<=m;++i) for(int j=1;j<=n;++j){T theta=(j-1)*dtheta;
        Add_Vertex(cylinder.plane1.x1+TV({dlength*(i-1),cylinder.radius*(T)sin(theta),cylinder.radius*(T)cos(theta)}));}
    if(create_caps){Add_Vertex(cylinder.plane1.x1+TV());Add_Vertex(cylinder.plane1.x1+TV({cylinder.height,0,0}));}

    for(int j=1;j<=n;++j){int j_1=j==n?1:j+1;
        for(int i=1;i<=m-1;++i){
            Add_Element(INDEX({j+(i-1)*n-1,j+i*n-1,j_1+i*n-1}));
            Add_Element(INDEX({j+(i-1)*n-1,j_1+i*n-1,j_1+(i-1)*n-1}));}
        if(create_caps){
            Add_Element(INDEX({m*n,j-1,j_1-1}));
            Add_Element(INDEX({m*n+1,j_1+(m-1)*n-1,j+(m-1)*n-1}));}}
    number_of_nodes=points.size();
}